

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  int iVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider test_suite_name;
  bool bVar5;
  undefined1 uVar6;
  ostream *poVar7;
  TestFactoryBase *pTVar8;
  char *str;
  type_info *type;
  char *str_00;
  type_info *type_00;
  char *str_01;
  type_info *type_01;
  char *str_02;
  type_info *type_02;
  char *str_03;
  type_info *type_03;
  char *str_04;
  type_info *type_04;
  char *str_05;
  type_info *type_05;
  char *str_06;
  type_info *type_06;
  GTestLog local_364;
  CodeLocation *local_360;
  string local_358;
  allocator local_331;
  string local_330;
  string local_310;
  CodeLocation local_2f0;
  string local_2c8;
  CodeLocation local_2a8;
  CodeLocation local_280;
  string local_258;
  CodeLocation local_238;
  string local_210;
  CodeLocation local_1f0;
  string local_1c8;
  CodeLocation local_1a8;
  CodeLocation local_180;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  CodeLocation local_58;
  
  local_360 = code_location;
  std::__cxx11::string::string
            ((string *)&local_1f0,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_330);
  std::operator+(&local_238.file,&local_1f0.file,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_280.file,&local_238.file,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_280.file,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x2c0));
  _Var3._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_138,(internal *)0x1b6e4d,str);
  StripTrailingSpaces(&local_1a8.file,&local_138);
  _Var4._M_p = local_1a8.file._M_dataplus._M_p;
  GetTypeName_abi_cxx11_
            (&local_180.file,
             (internal *)&::(anonymous_namespace)::param<unsigned_short,0u,9u>::typeinfo,type);
  CodeLocation::CodeLocation(&local_58,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_358,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_358);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_358,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_358);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f358;
  MakeAndRegisterTestInfo
            (_Var3._M_p,_Var4._M_p,local_180.file._M_dataplus._M_p,(char *)0x0,&local_58,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,0u,9u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_1f0,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_310);
  std::operator+(&local_238.file,&local_1f0.file,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_280.file,&local_238.file,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_280.file,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x2e0));
  _Var4._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_118,(internal *)0x1b6e4d,str_00);
  StripTrailingSpaces(&local_1a8.file,&local_118);
  GetTypeName_abi_cxx11_
            (&local_358,(internal *)&::(anonymous_namespace)::param<unsigned_short,0u,15u>::typeinfo
             ,type_00);
  _Var3._M_p = local_358._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_180,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_330,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_330);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_330,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_330);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f418;
  MakeAndRegisterTestInfo
            (_Var4._M_p,local_1a8.file._M_dataplus._M_p,_Var3._M_p,(char *)0x0,&local_180,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,0u,15u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_1f0,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_2c8);
  std::operator+(&local_238.file,&local_1f0.file,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_280.file,&local_238.file,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_280.file,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x300));
  test_suite_name._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_f8,(internal *)0x1b6e4d,str_01);
  StripTrailingSpaces(&local_358,&local_f8);
  _Var3._M_p = local_358._M_dataplus._M_p;
  GetTypeName_abi_cxx11_
            (&local_330,(internal *)&::(anonymous_namespace)::param<unsigned_short,0u,16u>::typeinfo
             ,type_01);
  _Var4._M_p = local_330._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_1a8,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_310,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_310);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_310,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_310);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f4d8;
  MakeAndRegisterTestInfo
            (test_suite_name._M_p,_Var3._M_p,_Var4._M_p,(char *)0x0,&local_1a8,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_short,0u,16u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_358,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_258);
  std::operator+(&local_238.file,&local_358,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_280.file,&local_238.file,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_280.file,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 800));
  _Var4._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_d8,(internal *)0x1b6e4d,str_02);
  StripTrailingSpaces(&local_330,&local_d8);
  GetTypeName_abi_cxx11_
            (&local_310,(internal *)&::(anonymous_namespace)::param<unsigned_int,0u,17u>::typeinfo,
             type_02);
  _Var3._M_p = local_310._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_1f0,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f598;
  MakeAndRegisterTestInfo
            (_Var4._M_p,local_330._M_dataplus._M_p,_Var3._M_p,(char *)0x0,&local_1f0,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_int,0u,17u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::string
            ((string *)&local_330,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_210);
  std::operator+(&local_358,&local_330,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_280.file,&local_358,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_280.file,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x340));
  _Var3._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_b8,(internal *)0x1b6e4d,str_03);
  StripTrailingSpaces(&local_310,&local_b8);
  GetTypeName_abi_cxx11_
            (&local_2c8,(internal *)&::(anonymous_namespace)::param<unsigned_int,0u,31u>::typeinfo,
             type_03);
  _Var4._M_p = local_2c8._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_238,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_258,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_258);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_258,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_258);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f658;
  MakeAndRegisterTestInfo
            (_Var3._M_p,local_310._M_dataplus._M_p,_Var4._M_p,(char *)0x0,&local_238,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_int,0u,31u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string
            ((string *)&local_310,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_1c8);
  std::operator+(&local_330,&local_310,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_358,&local_330,"BitFieldAssignment");
  std::operator+(&local_2a8.file,&local_358,"/");
  std::operator+(&local_2f0.file,&local_2a8.file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x360));
  _Var3._M_p = local_2f0.file._M_dataplus._M_p;
  GetPrefixUntilComma_abi_cxx11_(&local_98,(internal *)0x1b6e4d,str_04);
  StripTrailingSpaces(&local_2c8,&local_98);
  GetTypeName_abi_cxx11_
            (&local_258,(internal *)&::(anonymous_namespace)::param<unsigned_int,0u,32u>::typeinfo,
             type_04);
  _Var4._M_p = local_258._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_280,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f718;
  MakeAndRegisterTestInfo
            (_Var3._M_p,local_2c8._M_dataplus._M_p,_Var4._M_p,(char *)0x0,&local_280,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_int,0u,32u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string
            ((string *)&local_2c8,anon_var_dwarf_73ef0 + 0x50,(allocator *)&local_158);
  std::operator+(&local_310,&local_2c8,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_330,&local_310,"BitFieldAssignment");
  std::operator+(&local_358,&local_330,"/");
  std::operator+(&local_2f0.file,&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x380));
  GetPrefixUntilComma_abi_cxx11_(&local_78,(internal *)0x1b6e4d,str_05);
  StripTrailingSpaces(&local_258,&local_78);
  GetTypeName_abi_cxx11_
            (&local_210,(internal *)&::(anonymous_namespace)::param<unsigned_long,0u,63u>::typeinfo,
             type_05);
  _Var3._M_p = local_210._M_dataplus._M_p;
  CodeLocation::CodeLocation(&local_2a8,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_1c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_1c8);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog((GTestLog *)&local_1c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog((GTestLog *)&local_1c8);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f7d8;
  MakeAndRegisterTestInfo
            (local_2f0.file._M_dataplus._M_p,local_258._M_dataplus._M_p,_Var3._M_p,(char *)0x0,
             &local_2a8,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_long,0u,63u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string((string *)&local_258,anon_var_dwarf_73ef0 + 0x50,&local_331);
  std::operator+(&local_2c8,&local_258,anon_var_dwarf_73ef0 + 0x50);
  std::operator+(&local_310,&local_2c8,"BitFieldAssignment");
  std::operator+(&local_330,&local_310,"/");
  std::operator+(&local_358,&local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_360->file)._M_dataplus._M_p + 0x3a0));
  GetPrefixUntilComma_abi_cxx11_(&local_1c8,(internal *)0x1b6e4d,str_06);
  StripTrailingSpaces(&local_210,&local_1c8);
  GetTypeName_abi_cxx11_
            (&local_158,(internal *)&::(anonymous_namespace)::param<unsigned_long,0u,64u>::typeinfo,
             type_06);
  CodeLocation::CodeLocation(&local_2f0,(CodeLocation *)prefix);
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog(&local_364,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog(&local_364);
  }
  pcVar2 = *(char **)prefix;
  iVar1 = *(int *)(prefix + 0x20);
  bVar5 = IsTrue(true);
  if (!bVar5) {
    GTestLog::GTestLog(&local_364,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Condition !test_case_fp || !test_suite_fp failed. ");
    poVar7 = std::operator<<(poVar7,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar7 = std::operator<<(poVar7,pcVar2);
    poVar7 = std::operator<<(poVar7,":");
    std::ostream::operator<<(poVar7,iVar1);
    GTestLog::~GTestLog(&local_364);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0020f898;
  MakeAndRegisterTestInfo
            (local_358._M_dataplus._M_p,local_210._M_dataplus._M_p,local_158._M_dataplus._M_p,
             (char *)0x0,&local_2f0,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_long,0u,64u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2c8);
  uVar6 = std::__cxx11::string::~string((string *)&local_258);
  return (bool)uVar6;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }